

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest::TextSerializerTest(TextSerializerTest *this)

{
  allocator local_11;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TextSerializerTest_001a3368;
  std::__cxx11::string::string((string *)&this->name,"my_metric",&local_11);
  (this->metric).label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->metric).counter.value = 0.0;
  (this->metric).gauge.value = 0.0;
  (this->metric).label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->metric).label.
  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->metric).info.value = 1.0;
  (this->metric).summary.sample_count = 0;
  (this->metric).summary.sample_sum = 0.0;
  (this->metric).summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->metric).summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->metric).summary.quantile.
  super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->metric).histogram.sample_count = 0;
  (this->metric).histogram.sample_sum = 0.0;
  (this->metric).histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->metric).histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->metric).histogram.bucket.
  super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->metric).untyped.value = 0.0;
  (this->metric).timestamp_ms = 0;
  (this->textSerializer).super_Serializer._vptr_Serializer = (_func_int **)&PTR__Serializer_001a3d50
  ;
  return;
}

Assistant:

std::string Serialize(MetricType type) const {
    MetricFamily metricFamily;
    metricFamily.name = name;
    metricFamily.help = "my metric help text";
    metricFamily.type = type;
    metricFamily.metric = std::vector<ClientMetric>{metric};

    std::vector<MetricFamily> families{metricFamily};

    return textSerializer.Serialize(families);
  }